

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_FireMauler2Pre(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *ent;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  DPSprite *pDVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  FSoundID local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d2195;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar5 = numparam;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (ent->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar5 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar11);
      if (pPVar8 != pPVar3 && !bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d2195;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d216a;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar10,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d2195;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_2c.ID = S_FindSound("weapons/mauler2charge");
      S_Sound(ent,1,&local_2c,1.0,1.0);
      if (ent->player != (player_t *)0x0) {
        uVar5 = FRandom::GenRand32(&pr_mauler2);
        uVar6 = FRandom::GenRand32(&pr_mauler2);
        pDVar9 = player_t::GetPSprite(ent->player,PSP_WEAPON);
        pDVar9->x = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625 + pDVar9->x;
        uVar5 = FRandom::GenRand32(&pr_mauler2);
        uVar6 = FRandom::GenRand32(&pr_mauler2);
        pDVar9 = player_t::GetPSprite(ent->player,PSP_WEAPON);
        pDVar9->y = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625 + pDVar9->y;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d216a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d2195:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x1f1,"int AF_A_FireMauler2Pre(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireMauler2Pre)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_WEAPON, "weapons/mauler2charge", 1, ATTN_NORM);

	if (self->player != nullptr)
	{
		self->player->GetPSprite(PSP_WEAPON)->x += pr_mauler2.Random2() / 64.;
		self->player->GetPSprite(PSP_WEAPON)->y += pr_mauler2.Random2() / 64.;
	}
	return 0;
}